

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall capnp::SchemaLoader::SchemaLoader(SchemaLoader *this)

{
  Own<capnp::SchemaLoader::Impl> local_20;
  SchemaLoader *local_10;
  SchemaLoader *this_local;
  
  local_10 = this;
  kj::heap<capnp::SchemaLoader::Impl,capnp::SchemaLoader&>((kj *)&local_20,this);
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>>::
  MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>>
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>> *)this,&local_20);
  kj::Own<capnp::SchemaLoader::Impl>::~Own(&local_20);
  return;
}

Assistant:

SchemaLoader::SchemaLoader(): impl(kj::heap<Impl>(*this)) {}